

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

void xml_print_ns(lyout *out,lyd_node *node,int options)

{
  LYS_NODE LVar1;
  lyd_attr *plVar2;
  lys_node *plVar3;
  mlist *pmVar4;
  uint __line;
  int iVar5;
  lys_module *plVar6;
  lyd_node *plVar7;
  lyd_node **pplVar8;
  char *pcVar9;
  lyd_attr **pplVar10;
  lyd_node *plVar11;
  mlist *pmVar12;
  mlist *local_40;
  lyd_node *local_38;
  
  local_40 = (mlist *)0x0;
  if (out == (lyout *)0x0) {
    pcVar9 = "out";
    __line = 0x48;
LAB_0018b1a5:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,__line,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  local_38 = (lyd_node *)CONCAT44(local_38._4_4_,options);
  if (node == (lyd_node *)0x0) {
    pcVar9 = "node";
    __line = 0x49;
    goto LAB_0018b1a5;
  }
  pplVar10 = &node->attr;
  while( true ) {
    plVar2 = *pplVar10;
    plVar3 = node->schema;
    if (plVar2 == (lyd_attr *)0x0) break;
    iVar5 = strcmp(plVar3->name,"filter");
    if (iVar5 == 0) {
      pcVar9 = plVar3->module->name;
      iVar5 = strcmp(pcVar9,"ietf-netconf");
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar9,"notifications"), iVar5 != 0)) goto LAB_0018af3d;
    }
    else {
LAB_0018af3d:
      plVar6 = lys_main_module(plVar2->annotation->module);
      iVar5 = modlist_add(&local_40,plVar6);
      pmVar12 = local_40;
      if (iVar5 != 0) goto LAB_0018b03b;
    }
    pplVar10 = &plVar2->next;
  }
  LVar1 = plVar3->nodetype;
  if (LVar1 == LYS_CONTAINER) {
LAB_0018affd:
    if (((((ulong)local_38 & 0xc0) == 0) ||
        (plVar6 = ly_ctx_get_module(plVar3->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1),
        plVar6 == (lys_module *)0x0)) ||
       (iVar5 = modlist_add(&local_40,plVar6), pmVar12 = local_40, iVar5 == 0)) {
      pplVar8 = &node->child;
      while (local_38 = *pplVar8, plVar11 = local_38, pmVar12 = local_40,
            local_38 != (lyd_node *)0x0) {
        while (plVar7 = plVar11, plVar7 != (lyd_node *)0x0) {
          pplVar10 = &plVar7->attr;
          while( true ) {
            plVar2 = *pplVar10;
            plVar3 = plVar7->schema;
            if (plVar2 == (lyd_attr *)0x0) break;
            iVar5 = strcmp(plVar3->name,"filter");
            if (iVar5 == 0) {
              pcVar9 = plVar3->module->name;
              iVar5 = strcmp(pcVar9,"ietf-netconf");
              if ((iVar5 != 0) && (iVar5 = strcmp(pcVar9,"notifications"), iVar5 != 0))
              goto LAB_0018b0c5;
            }
            else {
LAB_0018b0c5:
              plVar6 = lys_main_module(plVar2->annotation->module);
              iVar5 = modlist_add(&local_40,plVar6);
              pmVar12 = local_40;
              if (iVar5 != 0) goto LAB_0018b03b;
            }
            pplVar10 = &plVar2->next;
          }
          if (((plVar3->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
             (plVar11 = plVar7->child, plVar11 != (lyd_node *)0x0)) goto LAB_0018b150;
          if (plVar7 == local_38) break;
          do {
            plVar11 = plVar7->next;
LAB_0018b150:
          } while ((plVar11 == (lyd_node *)0x0) &&
                  (plVar7 = plVar7->parent, plVar7->parent != local_38->parent));
        }
        pplVar8 = &local_38->next;
      }
    }
  }
  else {
    pmVar12 = local_40;
    if (LVar1 != LYS_LEAF) {
      if ((((LVar1 == LYS_ACTION) || (LVar1 == LYS_LIST)) || (LVar1 == LYS_NOTIF)) ||
         (LVar1 == LYS_RPC)) goto LAB_0018affd;
      if (LVar1 != LYS_LEAFLIST) goto LAB_0018b03b;
    }
    if (((((ulong)local_38 & 0xc0) != 0) && ((node->field_0x9 & 1) != 0)) &&
       (plVar6 = ly_ctx_get_module(plVar3->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1),
       pmVar12 = local_40, plVar6 != (lys_module *)0x0)) {
      modlist_add(&local_40,plVar6);
      pmVar12 = local_40;
    }
  }
LAB_0018b03b:
  while (pmVar12 != (mlist *)0x0) {
    pmVar4 = pmVar12->next;
    ly_print(out," xmlns:%s=\"%s\"",pmVar12->module->prefix,pmVar12->module->ns);
    free(pmVar12);
    pmVar12 = pmVar4;
  }
  return;
}

Assistant:

static void
xml_print_ns(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_node *next, *cur, *node2;
    struct lyd_attr *attr;
    const struct lys_module *wdmod = NULL;
    struct mlist *mlist = NULL, *miter;
    int r;

    assert(out);
    assert(node);

    /* add node attribute modules */
    for (attr = node->attr; attr; attr = attr->next) {
        if (!strcmp(node->schema->name, "filter") &&
                (!strcmp(node->schema->module->name, "ietf-netconf") ||
                 !strcmp(node->schema->module->name, "notifications"))) {
            /* exception for NETCONF's filter attributes */
            continue;
        } else {
            r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
        }
        if (r) {
            goto print;
        }
    }

    /* add node children nodes and attribute modules */
    switch (node->schema->nodetype) {
    case LYS_LEAFLIST:
    case LYS_LEAF:
        if (node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
        if (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG)) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }

        LY_TREE_FOR(node->child, node2) {
            LY_TREE_DFS_BEGIN(node2, next, cur) {
                for (attr = cur->attr; attr; attr = attr->next) {
                    if (!strcmp(cur->schema->name, "filter") &&
                            (!strcmp(cur->schema->module->name, "ietf-netconf") ||
                             !strcmp(cur->schema->module->name, "notifications"))) {
                        /* exception for NETCONF's filter attributes */
                        continue;
                    } else {
                        r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
                    }
                    if (r) {
                        goto print;
                    }
                }
            LY_TREE_DFS_END(node2, next, cur)}
        }
        break;
    default:
        break;
    }

print:
    /* print used namespaces */
    while (mlist) {
        miter = mlist;
        mlist = mlist->next;

        ly_print(out, " xmlns:%s=\"%s\"", miter->module->prefix, miter->module->ns);
        free(miter);
    }
}